

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fBooleanStateQueryTests.cpp
# Opt level: O0

void __thiscall
deqp::gles3::Functional::BooleanStateQueryVerifiers::GetIntegerVerifier::verifyBoolean4
          (GetIntegerVerifier *this,TestContext *testCtx,GLenum name,bool reference0,bool reference1
          ,bool reference2,bool reference3)

{
  int pname;
  bool bVar1;
  qpTestResult qVar2;
  int (*paiVar3) [4];
  TestLog *this_00;
  MessageBuilder *pMVar4;
  MessageBuilder local_1e8;
  uint local_68;
  uint local_64;
  GLint referenceAsGLint [4];
  undefined1 local_50 [8];
  StateQueryMemoryWriteGuard<int[4]> boolVector4;
  bool reference3_local;
  bool reference2_local;
  bool reference1_local;
  bool reference0_local;
  GLenum name_local;
  TestContext *testCtx_local;
  GetIntegerVerifier *this_local;
  
  boolVector4.m_postguard[2]._0_1_ = reference3;
  boolVector4.m_postguard[2]._1_1_ = reference2;
  boolVector4.m_postguard[2]._2_1_ = reference1;
  boolVector4.m_postguard[2]._3_1_ = reference0;
  boolVector4.m_postguard[3] = name;
  deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<int[4]>::StateQueryMemoryWriteGuard
            ((StateQueryMemoryWriteGuard<int[4]> *)local_50);
  pname = boolVector4.m_postguard[3];
  paiVar3 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard::operator_cast_to_function_pointer
                      ((StateQueryMemoryWriteGuard *)local_50);
  glu::CallLogWrapper::glGetIntegerv
            (&(this->super_StateVerifier).super_CallLogWrapper,pname,*paiVar3);
  bVar1 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<int[4]>::verifyValidity
                    ((StateQueryMemoryWriteGuard<int[4]> *)local_50,testCtx);
  if (bVar1) {
    local_68 = (uint)((boolVector4.m_postguard[2]._3_1_ & 1) != 0);
    local_64 = (uint)((boolVector4.m_postguard[2]._2_1_ & 1) != 0);
    referenceAsGLint[0] = (GLint)((boolVector4.m_postguard[2]._1_1_ & 1) != 0);
    referenceAsGLint[1] = (GLint)(((byte)boolVector4.m_postguard[2] & 1) != 0);
    paiVar3 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard::
              operator_cast_to_function_pointer((StateQueryMemoryWriteGuard *)local_50);
    if (((((*paiVar3)[0] != local_68) ||
         (paiVar3 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard::
                    operator_cast_to_function_pointer((StateQueryMemoryWriteGuard *)local_50),
         (*paiVar3)[1] != local_64)) ||
        (paiVar3 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard::
                   operator_cast_to_function_pointer((StateQueryMemoryWriteGuard *)local_50),
        (*paiVar3)[2] != referenceAsGLint[0])) ||
       (paiVar3 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard::
                  operator_cast_to_function_pointer((StateQueryMemoryWriteGuard *)local_50),
       (*paiVar3)[3] != referenceAsGLint[1])) {
      this_00 = tcu::TestContext::getLog(testCtx);
      tcu::TestLog::operator<<(&local_1e8,this_00,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar4 = tcu::MessageBuilder::operator<<(&local_1e8,(char (*) [20])"// ERROR: expected ");
      pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(int *)&local_68);
      pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(char (*) [2])0x2c6cdd6);
      pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(int *)&local_64);
      pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(char (*) [2])0x2c6cdd6);
      pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,referenceAsGLint);
      pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(char (*) [2])0x2c6cdd6);
      pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,referenceAsGLint + 1);
      pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(char (*) [2])0x2c6cdd6);
      tcu::MessageBuilder::operator<<(pMVar4,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_1e8);
      qVar2 = tcu::TestContext::getTestResult(testCtx);
      if (qVar2 == QP_TEST_RESULT_PASS) {
        tcu::TestContext::setTestResult(testCtx,QP_TEST_RESULT_FAIL,"Got invalid integer value");
      }
    }
  }
  return;
}

Assistant:

void GetIntegerVerifier::verifyBoolean4 (tcu::TestContext& testCtx, GLenum name, bool reference0, bool reference1, bool reference2, bool reference3)
{
	using tcu::TestLog;

	StateQueryMemoryWriteGuard<GLint[4]> boolVector4;
	glGetIntegerv(name, boolVector4);

	if (!boolVector4.verifyValidity(testCtx))
		return;

	const GLint referenceAsGLint[] =
	{
		reference0 ? 1 : 0,
		reference1 ? 1 : 0,
		reference2 ? 1 : 0,
		reference3 ? 1 : 0,
	};

	if (boolVector4[0] != referenceAsGLint[0] ||
		boolVector4[1] != referenceAsGLint[1] ||
		boolVector4[2] != referenceAsGLint[2] ||
		boolVector4[3] != referenceAsGLint[3])
	{
		testCtx.getLog() << TestLog::Message << "// ERROR: expected "
			<< referenceAsGLint[0] << " "
			<< referenceAsGLint[1] << " "
			<< referenceAsGLint[2] << " "
			<< referenceAsGLint[3] << " " << TestLog::EndMessage;

		if (testCtx.getTestResult() == QP_TEST_RESULT_PASS)
			testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Got invalid integer value");
	}
}